

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall slang::ast::EvalContext::reportDiags(EvalContext *this,Diagnostics *diagSet)

{
  if ((diagSet->super_SmallVector<slang::Diagnostic,_2UL>).super_SmallVectorBase<slang::Diagnostic>.
      len != 0) {
    if (((this->astCtx).assertionInstance != (AssertionInstanceDetails *)0x0) &&
       (this->backtraceReported == false)) {
      ASTContext::addAssertionBacktrace
                (&this->astCtx,
                 (diagSet->super_SmallVector<slang::Diagnostic,_2UL>).
                 super_SmallVectorBase<slang::Diagnostic>.data_);
      this->backtraceReported = true;
    }
    Scope::addDiags((this->astCtx).scope.ptr,diagSet);
    SmallVectorBase<slang::Diagnostic>::clear((SmallVectorBase<slang::Diagnostic> *)diagSet);
    return;
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return len == 0; }